

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_object_toString(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  undefined1 auVar1 [16];
  ushort uVar2;
  int iVar3;
  JSValueUnion JVar4;
  size_t buf_len;
  uint uVar5;
  char *buf;
  JSRefCountHeader *p_1;
  JSRefCountHeader *p;
  JSAtom atom;
  ulong uVar6;
  char cVar7;
  JSValue JVar8;
  JSValue obj;
  
  if ((int)this_val.tag == 3) {
    buf = "Undefined";
    buf_len = 9;
  }
  else {
    if ((int)this_val.tag != 2) {
      obj = JS_ToObject(ctx,this_val);
      JVar4 = obj.u;
      uVar5 = (uint)obj.tag;
      if (uVar5 == 6) {
        return obj;
      }
      if (uVar5 == 0xffffffff) {
        uVar2 = *(ushort *)((long)JVar4.ptr + 6);
        atom = 0x90;
        if (uVar2 != 2) {
          if (uVar2 == 0x29) {
            iVar3 = js_proxy_isArray(ctx,obj);
            if (iVar3 < 0) {
              iVar3 = *JVar4.ptr;
              *(int *)JVar4.ptr = iVar3 + -1;
              uVar6 = 6;
              if (iVar3 < 2) {
                __JS_FreeValueRT(ctx->rt,obj);
              }
              goto LAB_001607eb;
            }
            atom = 0x90;
            if (iVar3 != 0) goto LAB_0016073a;
            uVar2 = *(ushort *)((long)JVar4.ptr + 6);
          }
          atom = 0x9a;
          if (uVar2 != 0xd) {
            if (uVar2 == 0x29) {
              cVar7 = *(char *)(*(long *)((long)JVar4.ptr + 0x30) + 0x20);
            }
            else {
              cVar7 = ctx->rt->class_array[uVar2].call != (JSClassCall *)0x0;
            }
            if (cVar7 == '\0') goto LAB_00160762;
          }
        }
LAB_0016073a:
        JVar8 = JS_GetPropertyInternal(ctx,obj,0xcc,obj,0);
LAB_001607b8:
        iVar3 = *JVar4.ptr;
        *(int *)JVar4.ptr = iVar3 + -1;
        if (iVar3 < 2) {
          __JS_FreeValueRT(ctx->rt,obj);
        }
      }
      else {
LAB_00160762:
        uVar2 = *(ushort *)((long)JVar4.ptr + 6);
        atom = 0x8f;
        if ((uVar2 < 0x13) && ((0x40778U >> (uVar2 & 0x1f) & 1) != 0)) {
          atom = ctx->rt->class_array[uVar2].class_name;
        }
        JVar8 = JS_GetPropertyInternal(ctx,obj,0xcc,obj,0);
        if (0xfffffff4 < uVar5) goto LAB_001607b8;
      }
      uVar5 = (uint)JVar8.tag;
      if (uVar5 != 0xfffffff9) {
        uVar6 = (ulong)uVar5;
        if (uVar5 == 6) {
LAB_001607eb:
          auVar1._8_8_ = 0;
          auVar1._0_8_ = uVar6;
          return (JSValue)(auVar1 << 0x40);
        }
        if ((0xfffffff4 < uVar5) &&
           (iVar3 = *JVar8.u.ptr, *(int *)JVar8.u.ptr = iVar3 + -1, iVar3 < 2)) {
          __JS_FreeValueRT(ctx->rt,JVar8);
        }
        JVar8 = __JS_AtomToValue(ctx,atom,1);
      }
      goto LAB_00160694;
    }
    buf = "Null";
    buf_len = 4;
  }
  JVar8 = JS_NewStringLen(ctx,buf,buf_len);
LAB_00160694:
  JVar8 = JS_ConcatString3(ctx,"[object ",JVar8,"]");
  return JVar8;
}

Assistant:

static JSValue js_object_toString(JSContext *ctx, JSValueConst this_val,
                                  int argc, JSValueConst *argv)
{
    JSValue obj, tag;
    int is_array;
    JSAtom atom;
    JSObject *p;

    if (JS_IsNull(this_val)) {
        tag = JS_NewString(ctx, "Null");
    } else if (JS_IsUndefined(this_val)) {
        tag = JS_NewString(ctx, "Undefined");
    } else {
        obj = JS_ToObject(ctx, this_val);
        if (JS_IsException(obj))
            return obj;
        is_array = JS_IsArray(ctx, obj);
        if (is_array < 0) {
            JS_FreeValue(ctx, obj);
            return JS_EXCEPTION;
        }
        if (is_array) {
            atom = JS_ATOM_Array;
        } else if (JS_IsFunction(ctx, obj)) {
            atom = JS_ATOM_Function;
        } else {
            p = JS_VALUE_GET_OBJ(obj);
            switch(p->class_id) {
            case JS_CLASS_STRING:
            case JS_CLASS_ARGUMENTS:
            case JS_CLASS_MAPPED_ARGUMENTS:
            case JS_CLASS_ERROR:
            case JS_CLASS_BOOLEAN:
            case JS_CLASS_NUMBER:
            case JS_CLASS_DATE:
            case JS_CLASS_REGEXP:
                atom = ctx->rt->class_array[p->class_id].class_name;
                break;
            default:
                atom = JS_ATOM_Object;
                break;
            }
        }
        tag = JS_GetProperty(ctx, obj, JS_ATOM_Symbol_toStringTag);
        JS_FreeValue(ctx, obj);
        if (JS_IsException(tag))
            return JS_EXCEPTION;
        if (!JS_IsString(tag)) {
            JS_FreeValue(ctx, tag);
            tag = JS_AtomToString(ctx, atom);
        }
    }
    return JS_ConcatString3(ctx, "[object ", tag, "]");
}